

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

string * __thiscall rcg::Stream::getTLType_abi_cxx11_(Stream *this)

{
  GC_ERROR GVar1;
  element_type *peVar2;
  long in_RSI;
  string *in_RDI;
  size_t size;
  char tmp [1024];
  INFO_DATATYPE type;
  lock_guard<std::recursive_mutex> lock;
  string *ret;
  mutex_type *in_stack_fffffffffffffb98;
  undefined4 in_stack_fffffffffffffba0;
  undefined4 in_stack_fffffffffffffba4;
  size_t local_430;
  char local_428 [1032];
  int local_20;
  undefined1 local_19;
  
  std::lock_guard<std::recursive_mutex>::lock_guard
            ((lock_guard<std::recursive_mutex> *)
             CONCAT44(in_stack_fffffffffffffba4,in_stack_fffffffffffffba0),in_stack_fffffffffffffb98
            );
  local_19 = 0;
  std::__cxx11::string::string(in_RDI);
  memset(local_428,0,0x400);
  local_430 = 0x400;
  if (*(long *)(in_RSI + 0xd0) != 0) {
    peVar2 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x121a52);
    GVar1 = (*peVar2->DSGetInfo)(*(DS_HANDLE *)(in_RSI + 0xd0),10,&local_20,local_428,&local_430);
    if ((GVar1 == 0) && (local_20 == 1)) {
      std::__cxx11::string::operator=(in_RDI,local_428);
    }
  }
  local_19 = 1;
  std::lock_guard<std::recursive_mutex>::~lock_guard((lock_guard<std::recursive_mutex> *)0x121afe);
  return in_RDI;
}

Assistant:

std::string Stream::getTLType()
{
  std::lock_guard<std::recursive_mutex> lock(mtx);
  std::string ret;

  GenTL::INFO_DATATYPE type;
  char tmp[1024]="";
  size_t size=sizeof(tmp);

  if (stream != 0)
  {
    if (gentl->DSGetInfo(stream, GenTL::STREAM_INFO_TLTYPE, &type, tmp, &size) ==
        GenTL::GC_ERR_SUCCESS)
    {
      if (type == GenTL::INFO_DATATYPE_STRING)
      {
        ret=tmp;
      }
    }
  }

  return ret;
}